

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe53At1(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)((uint)buf[4] | (uint)buf[5] << 8 | (buf[6] & 0x3f) << 0x10) << 0x1f;
  uVar3 = ((uint)(*buf >> 1) | (uint)buf[1] << 7 | (uint)buf[2] << 0xf | (uint)buf[3] << 0x17) |
          uVar2;
  uVar1 = uVar3 | 0xffe0000000000000;
  if (uVar2 >> 0x34 == 0) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntLe53At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 7;
    res |= (buf[0] >> 1);
    res &= UINT64_C(0x1fffffffffffff);

    if (res >> 52) {
        res |= UINT64_C(0xffe0000000000000);
    }

    return static_cast<std::int64_t>(res);
}